

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_true,_false>::edge_
          (DaTrie<true,_true,_false> *this,uint32_t node_pos,Edge *edge,size_t upper)

{
  uint8_t uVar1;
  uint uVar2;
  ulong uVar3;
  pointer pNVar4;
  ulong uVar5;
  
  edge->size_ = 0;
  uVar2 = SUB84((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start[node_pos],0);
  if ((~uVar2 & 0x7fffffff) != 0 && -1 < (int)uVar2) {
    uVar1 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
            _M_impl.super__Vector_impl_data._M_start[node_pos].child;
    edge->size_ = 1;
    edge->labels_[0] = uVar1;
    if (1 < upper) {
      pNVar4 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>
               ._M_impl.super__Vector_impl_data._M_start + node_pos;
      uVar3 = 1;
      do {
        uVar5 = (ulong)pNVar4->child ^ (ulong)(uVar2 & 0x7fffffff);
        pNVar4 = (this->node_links_).
                 super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar1 = pNVar4[uVar5].sib;
        if (uVar1 == pNVar4[node_pos].child) {
          return;
        }
        edge->size_ = uVar3 + 1;
        edge->labels_[uVar3] = uVar1;
        pNVar4 = (pointer)&(this->node_links_).
                           super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar5].sib;
        uVar3 = edge->size_;
      } while (uVar3 < upper);
    }
  }
  return;
}

Assistant:

size_t size() const { return size_; }